

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlacon2.c
# Opt level: O3

int dlacon2_(int *n,double *v,double *x,int *isgn,double *est,int *kase,int *isave)

{
  int iVar1;
  uint uVar2;
  doublereal dVar3;
  undefined1 auVar4 [16];
  integer iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  undefined1 auVar13 [16];
  integer local_4c;
  undefined1 local_48 [16];
  long lVar11;
  
  auVar4 = _DAT_00113450;
  local_48._8_8_ = local_48._0_8_;
  local_4c = 1;
  if (*kase == 0) {
    iVar8 = *n;
    if (0 < (long)iVar8) {
      lVar6 = (long)iVar8 + -1;
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar9 = auVar9 ^ _DAT_00113450;
      auVar10 = _DAT_00113440;
      do {
        auVar13 = auVar10 ^ auVar4;
        if ((bool)(~(auVar13._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar13._0_4_ ||
                    auVar9._4_4_ < auVar13._4_4_) & 1)) {
          *(double *)((long)x + lVar6) = 1.0 / (double)iVar8;
        }
        if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
            auVar13._12_4_ <= auVar9._12_4_) {
          *(double *)((long)x + lVar6 + 8) = 1.0 / (double)iVar8;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(iVar8 + 1U >> 1) << 4 != lVar6);
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar5 = idamax_(n,x,&local_4c);
    iVar8 = iVar5 + -1;
    isave[1] = iVar8;
    isave[2] = 2;
LAB_00110289:
    if (0 < (long)*n) {
      memset(x,0,(long)*n << 3);
    }
    x[iVar8] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 3:
    dcopy_(n,x,&local_4c,v,&local_4c);
    local_48._0_8_ = *est;
    dVar3 = dasum_(n,v,&local_4c);
    *est = dVar3;
    if ((long)*n < 1) goto LAB_001104d9;
    lVar6 = 0;
    do {
      if ((*(double *)(&DAT_00114c30 + (ulong)(x[lVar6] < 0.0) * 8) != (double)isgn[lVar6]) ||
         (NAN(*(double *)(&DAT_00114c30 + (ulong)(x[lVar6] < 0.0) * 8)) || NAN((double)isgn[lVar6]))
         ) {
        if ((double)local_48._0_8_ < dVar3) {
          lVar6 = 0;
          do {
            dVar12 = x[lVar6];
            x[lVar6] = *(double *)(&DAT_00114c30 + (ulong)(dVar12 < 0.0) * 8);
            isgn[lVar6] = -(uint)(dVar12 < 0.0) | 1;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *n);
          *kase = 2;
          *isave = 4;
          return 0;
        }
        break;
      }
      lVar6 = lVar6 + 1;
    } while (*n != lVar6);
    break;
  case 4:
    iVar1 = isave[1];
    iVar5 = idamax_(n,x,&local_4c);
    iVar8 = iVar5 + -1;
    isave[1] = iVar8;
    if (((x[iVar1] != ABS(x[(long)iVar5 + -1])) || (NAN(x[iVar1]) || NAN(ABS(x[(long)iVar5 + -1]))))
       && (isave[2] < 5)) {
      isave[2] = isave[2] + 1;
      goto LAB_00110289;
    }
    break;
  case 5:
    dVar3 = dasum_(n,x,&local_4c);
    dVar12 = dVar3 / (double)(*n * 3);
    dVar12 = dVar12 + dVar12;
    if (dVar12 < *est || dVar12 == *est) goto LAB_001103cb;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar12;
    local_48._12_4_ = extraout_XMM0_Dd;
    dcopy_(n,x,&local_4c,v,&local_4c);
    goto LAB_001103c5;
  default:
    if (*n != 1) {
      dVar3 = dasum_(n,x,&local_4c);
      *est = dVar3;
      if (0 < *n) {
        lVar6 = 0;
        do {
          dVar12 = x[lVar6];
          x[lVar6] = *(double *)(&DAT_00114c30 + (ulong)(dVar12 < 0.0) * 8);
          isgn[lVar6] = -(uint)(dVar12 < 0.0) | 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < *n);
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    dVar12 = *x;
    *v = dVar12;
    dVar12 = ABS(dVar12);
    local_48._0_4_ = SUB84(dVar12,0);
    local_48._4_4_ = (undefined4)((ulong)dVar12 >> 0x20);
LAB_001103c5:
    *est = (double)CONCAT44(local_48._4_4_,local_48._0_4_);
LAB_001103cb:
    *kase = 0;
    return 0;
  }
  uVar2 = *n;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    dVar12 = 1.0;
    do {
      x[uVar7] = ((double)(int)uVar7 / (double)(int)(uVar2 - 1) + 1.0) * dVar12;
      dVar12 = -dVar12;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
LAB_001104d9:
  *kase = 1;
  *isave = 5;
  return 0;
}

Assistant:

int
dlacon2_(int *n, double *v, double *x, int *isgn, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    double      zero = 0.0;
    double      one = 1.0;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
#ifdef _CRAY
    extern int ISAMAX(int *, double *, int *);
    extern double SASUM(int *, double *, int *);
    extern int SCOPY(int *, double *, int *, double *, int *);
#else
    extern int idamax_(int *, double *, int *);
    extern double dasum_(int *, double *, int *);
    extern void dcopy_(int *, double *, int *, double *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (double) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = dasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    dcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = dasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (double)(*n * 3) * 2.;
#else
    temp = dasum_(n, x, &c__1) / (double)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	dcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}